

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> * __thiscall
args::Group::GetAllFlags(Group *this)

{
  bool bVar1;
  reference ppBVar2;
  iterator this_00;
  Group *in_RSI;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *in_RDI;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> childRes;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *res;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffff48;
  __normal_iterator<args::FlagBase_*const_*,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  *in_stack_ffffffffffffff50;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *this_01;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<args::FlagBase_*const_*,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
  local_50 [3];
  Base *local_38;
  Base **local_30;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_28;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::vector
            ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)0x1fbe2e);
  local_20 = Children(in_RSI);
  local_28._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          (in_stack_ffffffffffffff48);
  local_30 = (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end
                                (in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&local_28);
    local_38 = *ppBVar2;
    (*local_38->_vptr_Base[9])(local_50);
    this_00 = std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
                        ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)
                         in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<args::FlagBase*const*,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>
    ::__normal_iterator<args::FlagBase**>
              (in_stack_ffffffffffffff50,
               (__normal_iterator<args::FlagBase_**,_std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>_>
                *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 = local_50;
    std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::begin
              ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)
               in_stack_ffffffffffffff48);
    std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::end
              ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)
               in_stack_ffffffffffffff48);
    std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>::
    insert<__gnu_cxx::__normal_iterator<args::FlagBase**,std::vector<args::FlagBase*,std::allocator<args::FlagBase*>>>,void>
              ((vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> *)this_00._M_current,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_>::~vector(this_01);
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;
                for (Base *child: Children())
                {
                    auto childRes = child->GetAllFlags();
                    res.insert(res.end(), childRes.begin(), childRes.end());
                }
                return res;
            }